

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<signed_char,long_double>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,char *t_lhs,char *c_lhs,
          longdouble *c_rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 *puVar2;
  bool b;
  longdouble lVar3;
  longdouble lVar4;
  Boxed_Value BVar5;
  char local_3e;
  char local_3c;
  char local_38;
  char local_34;
  char local_30;
  longdouble local_18;
  
  switch(t_oper) {
  case equals:
    b = (longdouble)(short)*c_lhs == *c_rhs;
    break;
  case less_than:
    lVar4 = (longdouble)(short)*c_lhs;
    lVar3 = *c_rhs;
    goto LAB_002d6e50;
  case greater_than:
    lVar3 = (longdouble)(short)*c_lhs;
    lVar4 = *c_rhs;
LAB_002d6e50:
    b = lVar4 < lVar3;
    break;
  case less_than_equal:
    lVar4 = (longdouble)(short)*c_lhs;
    lVar3 = *c_rhs;
    goto LAB_002d6e22;
  case greater_than_equal:
    lVar3 = (longdouble)(short)*c_lhs;
    lVar4 = *c_rhs;
LAB_002d6e22:
    b = lVar4 <= lVar3;
    break;
  case not_equal:
    b = (longdouble)(short)*c_lhs != *c_rhs;
    break;
  default:
    switch(t_oper) {
    case sum:
      local_18 = *c_rhs + (longdouble)(short)*c_lhs;
      break;
    case quotient:
      local_18 = (longdouble)(short)*c_lhs / *c_rhs;
      break;
    case product:
      local_18 = *c_rhs * (longdouble)(short)*c_lhs;
      break;
    case difference:
      local_18 = (longdouble)(short)*c_lhs - *c_rhs;
      break;
    default:
      if (t_lhs == (char *)0x0) {
switchD_002d6dbb_caseD_7:
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = &PTR__bad_cast_003c7e80;
        __cxa_throw(puVar2,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      switch(t_oper) {
      case assign:
        local_3e = (char)(short)ROUND(*c_rhs);
        local_30 = local_3e;
        break;
      default:
        goto switchD_002d6dbb_caseD_7;
      case assign_product:
        local_3c = (char)(short)ROUND(*c_rhs * (longdouble)(short)*t_lhs);
        local_30 = local_3c;
        break;
      case assign_sum:
        local_38 = (char)(short)ROUND(*c_rhs + (longdouble)(short)*t_lhs);
        local_30 = local_38;
        break;
      case assign_quotient:
        local_34 = (char)(short)ROUND((longdouble)(short)*t_lhs / *c_rhs);
        local_30 = local_34;
        break;
      case assign_difference:
        local_30 = (char)(short)ROUND((longdouble)(short)*t_lhs - *c_rhs);
      }
      *t_lhs = local_30;
      (this->bv).m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (t_bv->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var1 = (t_bv->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->bv).m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var1;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      goto LAB_002d6ea6;
    }
    BVar5 = detail::const_var_impl<long_double>((detail *)this,&local_18);
    t_bv = BVar5.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
    goto LAB_002d6ea6;
  }
  BVar5 = const_var((chaiscript *)this,b);
  t_bv = BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
LAB_002d6ea6:
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_bv;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }